

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
::init(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
       *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  int numBytes;
  int numBytes_00;
  char *local_378;
  MessageBuilder local_370;
  string local_1f0;
  string local_1d0;
  int local_1b0 [4];
  MessageBuilder local_1a0;
  value_type_conflict5 local_19;
  long local_18;
  Functions *gl;
  ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
  *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles3::Context::getRenderContext
                     ((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                      ).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>::
  init(&this->
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
       ,ctx);
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_zeroData,
             (long)(this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                   ).m_bufferSizeMax,&local_19);
  pTVar5 = tcu::TestContext::getLog
                     ((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                      ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [26])"Testing performance with ");
  local_1b0[0] = 0x14;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1b0);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [130])
                             " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
                     );
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [28])"Buffer sizes are in range [");
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                          ).m_bufferSizeMin,numBytes);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d0);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                          ).m_bufferSizeMax,numBytes_00);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f0);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pTVar5 = tcu::TestContext::getLog
                     ((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                      ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_370,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_370,
                      (char (*) [62])
                      "Test result is the median transfer rate of the test samples.\n");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])"Buffer usage = ");
  local_378 = glu::getUsageName(this->m_bufferUsage);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_378);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_370);
  pcVar1 = *(code **)(local_18 + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram
                    ((this->
                     super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                     ).m_dummyProgram);
  (*pcVar1)(dVar3);
  (**(code **)(local_18 + 0x1a00))(0,0,0x20);
  iVar2 = (**(code **)(local_18 + 0x610))
                    ((this->
                     super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                     ).m_dummyProgramPosLoc);
  return iVar2;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// init parent

	BasicBufferCase<SampleType>::init();

	// upload source
	m_zeroData.resize(m_bufferSizeMax, 0x00);

	// log basic info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance with " << (int)NUM_SAMPLES << " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Buffer sizes are in range [" << getHumanReadableByteSize(m_bufferSizeMin) << ", " << getHumanReadableByteSize(m_bufferSizeMax) << "]."
		<< tcu::TestLog::EndMessage;

	// log which transfer rate is the test result and buffer info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Test result is the median transfer rate of the test samples.\n"
		<< "Buffer usage = " << glu::getUsageName(m_bufferUsage)
		<< tcu::TestLog::EndMessage;

	// Set state for drawing so that we don't have to change these during the iteration
	{
		gl.useProgram(m_dummyProgram->getProgram());
		gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
		gl.enableVertexAttribArray(m_dummyProgramPosLoc);
	}
}